

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O0

string * __thiscall re2::Prefilter::DebugString_abi_cxx11_(Prefilter *this)

{
  ostream *poVar1;
  size_type sVar2;
  reference ppPVar3;
  int *in_RSI;
  string *in_RDI;
  bool bVar4;
  Prefilter *sub_1;
  size_t i_1;
  Prefilter *sub;
  size_t i;
  string *s;
  char *in_stack_fffffffffffffd78;
  allocator *paVar5;
  LogMessageFatal *in_stack_fffffffffffffd80;
  ulong uVar6;
  LogMessageFatal *in_stack_fffffffffffffd90;
  allocator local_209;
  string local_208 [32];
  value_type local_1e8;
  ulong local_1e0;
  allocator local_1d4;
  undefined1 local_1d3;
  byte local_1d2;
  allocator local_1d1;
  string local_1d0 [32];
  value_type local_1b0;
  ulong local_1a8;
  allocator local_1a0;
  undefined1 local_19f;
  allocator local_19e;
  allocator local_19d [389];
  Prefilter *in_stack_ffffffffffffffe8;
  
  switch(*in_RSI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_19e);
    std::allocator<char>::~allocator((allocator<char> *)&local_19e);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"*no-matches*",local_19d);
    std::allocator<char>::~allocator((allocator<char> *)local_19d);
    break;
  case 2:
    std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 4));
    break;
  case 3:
    local_19f = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a0);
    for (local_1a8 = 0; uVar6 = local_1a8,
        sVar2 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::size
                          (*(vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> **)
                            (in_RSI + 2)), uVar6 < sVar2; local_1a8 = local_1a8 + 1) {
      if (local_1a8 != 0) {
        std::__cxx11::string::operator+=((string *)in_RDI," ");
      }
      ppPVar3 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                          (*(vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> **)
                            (in_RSI + 2),local_1a8);
      local_1b0 = *ppPVar3;
      local_1d2 = 0;
      if (local_1b0 == (value_type)0x0) {
        paVar5 = &local_1d1;
        std::allocator<char>::allocator();
        local_1d2 = 1;
        std::__cxx11::string::string(local_1d0,"<nil>",paVar5);
      }
      else {
        DebugString_abi_cxx11_(in_stack_ffffffffffffffe8);
      }
      std::__cxx11::string::operator+=((string *)in_RDI,local_1d0);
      std::__cxx11::string::~string(local_1d0);
      if ((local_1d2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      }
    }
    break;
  case 4:
    local_1d3 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"(",&local_1d4);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d4);
    local_1e0 = 0;
    while (uVar6 = local_1e0,
          sVar2 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::size
                            (*(vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> **)
                              (in_RSI + 2)), uVar6 < sVar2) {
      if (local_1e0 != 0) {
        std::__cxx11::string::operator+=((string *)in_RDI,"|");
      }
      ppPVar3 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                          (*(vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> **)
                            (in_RSI + 2),local_1e0);
      local_1e8 = *ppPVar3;
      bVar4 = local_1e8 == (value_type)0x0;
      if (bVar4) {
        paVar5 = &local_209;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_208,"<nil>",paVar5);
      }
      else {
        DebugString_abi_cxx11_(in_stack_ffffffffffffffe8);
      }
      std::__cxx11::string::operator+=((string *)in_RDI,local_208);
      std::__cxx11::string::~string(local_208);
      if (bVar4) {
        std::allocator<char>::~allocator((allocator<char> *)&local_209);
      }
      local_1e0 = local_1e0 + 1;
    }
    std::__cxx11::string::operator+=((string *)in_RDI,")");
    break;
  default:
    LogMessageFatal::LogMessageFatal(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,0);
    poVar1 = LogMessage::stream((LogMessage *)(local_19d + 0xd));
    poVar1 = std::operator<<(poVar1,"Bad op in Prefilter::DebugString: ");
    std::ostream::operator<<(poVar1,*in_RSI);
    LogMessageFatal::~LogMessageFatal(in_stack_fffffffffffffd90);
  }
  return in_RDI;
}

Assistant:

std::string Prefilter::DebugString() const {
  switch (op_) {
    default:
      LOG(DFATAL) << "Bad op in Prefilter::DebugString: " << op_;
      return StringPrintf("op%d", op_);
    case NONE:
      return "*no-matches*";
    case ATOM:
      return atom_;
    case ALL:
      return "";
    case AND: {
      std::string s = "";
      for (size_t i = 0; i < subs_->size(); i++) {
        if (i > 0)
          s += " ";
        Prefilter* sub = (*subs_)[i];
        s += sub ? sub->DebugString() : "<nil>";
      }
      return s;
    }
    case OR: {
      std::string s = "(";
      for (size_t i = 0; i < subs_->size(); i++) {
        if (i > 0)
          s += "|";
        Prefilter* sub = (*subs_)[i];
        s += sub ? sub->DebugString() : "<nil>";
      }
      s += ")";
      return s;
    }
  }
}